

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

int __thiscall
TPZFMatrix<double>::Decompose_LU
          (TPZFMatrix<double> *this,list<long,_std::allocator<long>_> *singular)

{
  double dVar1;
  bool bVar2;
  value_type_conflict5 *__x;
  int64_t iVar3;
  double *pdVar4;
  TPZBaseMatrix *in_RDI;
  double a;
  double extraout_XMM0_Qa;
  double kjVal;
  double *ikPtr;
  double *elemPtr;
  int i_1;
  int j;
  int i;
  double pivot;
  int k;
  int ncols;
  int nrows;
  int min;
  char *in_stack_00000138;
  char *in_stack_00000140;
  int local_80;
  double in_stack_ffffffffffffff98;
  TPZFMatrix<double> *in_stack_ffffffffffffffa0;
  double *local_58;
  int local_4c;
  int local_48;
  int local_44;
  undefined8 local_40;
  long local_38;
  double local_30;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  if ((in_RDI->fDecomposed != '\0') && (in_RDI->fDecomposed != '\x01')) {
    Error(in_stack_00000140,in_stack_00000138);
  }
  if (in_RDI->fDecomposed == '\0') {
    __x = (value_type_conflict5 *)TPZBaseMatrix::Cols(in_RDI);
    iVar3 = TPZBaseMatrix::Rows(in_RDI);
    if ((long)__x < iVar3) {
      iVar3 = TPZBaseMatrix::Cols(in_RDI);
      local_80 = (int)iVar3;
    }
    else {
      iVar3 = TPZBaseMatrix::Rows(in_RDI);
      local_80 = (int)iVar3;
    }
    local_1c = local_80;
    iVar3 = TPZBaseMatrix::Rows(in_RDI);
    local_20 = (int)iVar3;
    iVar3 = TPZBaseMatrix::Cols(in_RDI);
    local_24 = (int)iVar3;
    for (local_28 = 0; local_28 < local_1c; local_28 = local_28 + 1) {
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_28,(long)local_28);
      local_30 = a;
      bVar2 = IsZero(a);
      local_44 = local_28;
      if (bVar2) {
        local_38 = (long)local_28;
        std::__cxx11::list<long,_std::allocator<long>_>::push_back
                  ((list<long,_std::allocator<long>_> *)in_RDI,__x);
        local_40 = 0x3ff0000000000000;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                  (in_RDI,(long)local_28,(long)local_28,&local_40);
        local_30 = 1.0;
        local_44 = local_28;
      }
      while (dVar1 = local_30, local_44 = local_44 + 1, local_48 = local_28, local_44 < local_20) {
        pdVar4 = operator()(in_stack_ffffffffffffffa0,(int64_t)in_stack_ffffffffffffff98,
                            (int64_t)in_RDI);
        *pdVar4 = *pdVar4 / dVar1;
      }
      while (local_4c = local_28, local_48 = local_48 + 1, local_48 < local_24) {
        local_58 = operator()(in_stack_ffffffffffffffa0,(int64_t)in_stack_ffffffffffffff98,
                              (int64_t)in_RDI);
        in_stack_ffffffffffffffa0 =
             (TPZFMatrix<double> *)
             operator()(in_stack_ffffffffffffffa0,(int64_t)in_stack_ffffffffffffff98,(int64_t)in_RDI
                       );
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_28,(long)local_48);
        while (local_4c = local_4c + 1, in_stack_ffffffffffffff98 = extraout_XMM0_Qa,
              local_4c < local_20) {
          *local_58 = -(double)(in_stack_ffffffffffffffa0->super_TPZMatrix<double>).
                               super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable *
                      extraout_XMM0_Qa + *local_58;
          local_58 = local_58 + 1;
          in_stack_ffffffffffffffa0 =
               (TPZFMatrix<double> *)
               &(in_stack_ffffffffffffffa0->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        }
      }
    }
    in_RDI->fDecomposed = '\x01';
  }
  return 1;
}

Assistant:

int TPZFMatrix<TVar>::Decompose_LU(std::list<int64_t> &singular) {
    //return Decompose_LU();
#ifndef USING_LAPACK
    if (  this->fDecomposed && this->fDecomposed != ELU)  Error( "Decompose_LU <Matrix already Decomposed with other scheme>" );
#else
    if (  this->fDecomposed && this->fDecomposed != ELUPivot)  Error( "Decompose_LU <Matrix already Decomposed with other scheme>" );
#endif
    if (this->fDecomposed) return 1;
    
    const int  min = ( this->Cols() < (this->Rows()) ) ? this->Cols() : this->Rows();
    const int nrows = this->Rows();
    const int ncols = this->Cols();
    
    for ( int k = 0; k < min ; k++ ) {
        TVar pivot = GetVal(k, k);
        if (IsZero( pivot )){
            singular.push_back(k);
            PutVal(k,k,1.);
            pivot = 1.;
        }
        for ( int i = k+1; i < nrows; i++ ) {
            this->operator()(i,k) /= pivot;
        }
        for ( int j = k+1; j < ncols; j++ ){
            int i = k+1;
            TVar * elemPtr = &(this->operator()(i,j));
            TVar * ikPtr = &(this->operator()(i,k));
            const TVar kjVal = GetVal(k,j);
            for ( ; i < nrows; i++, elemPtr++, ikPtr++ ) {
                (*elemPtr) -= (*ikPtr)*kjVal;
                //          this->operator()(i,j) -= GetVal( i, k )*GetVal(k,j);
            }
        }
    }
    this->fDecomposed=ELU;
#ifdef USING_LAPACK
    fPivot.resize(nrows);
    for (int i=0; i<nrows; i++) {
        fPivot[i] = i+1;
    }
    this->fDecomposed = ELUPivot;
#endif //USING_LAPACK
    return 1;
}